

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType samplerDataType;
  DataType DVar2;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  string shaderSource_09;
  string shaderSource_10;
  string shaderSource_11;
  string shaderSource_12;
  string shaderSource_13;
  string shaderSource_14;
  string shaderSource_15;
  string shaderSource_16;
  string shaderSource_17;
  string shaderSource_18;
  string shaderSource_19;
  string shaderSource_20;
  string shaderSource_21;
  string shaderSource_22;
  string shaderSource_23;
  string shaderSource_24;
  string shaderSource_25;
  string shaderSource_26;
  string shaderSource_27;
  string shaderSource_28;
  string shaderSource_29;
  string shaderSource_30;
  string shaderSource_31;
  string shaderSource_32;
  string shaderSource_33;
  string shaderSource_34;
  string shaderSource_35;
  string shaderSource_36;
  string shaderSource_37;
  string shaderSource_38;
  string shaderSource_39;
  string shaderSource_40;
  string shaderSource_41;
  string shaderSource_42;
  string shaderSource_43;
  string shaderSource_44;
  string shaderSource_45;
  string shaderSource_46;
  string shaderSource_47;
  string shaderSource_48;
  string shaderSource_49;
  string shaderSource_50;
  string shaderSource_51;
  string shaderSource_52;
  string shaderSource_53;
  string shaderSource_54;
  string shaderSource_55;
  string shaderSource_56;
  string shaderSource_57;
  string shaderSource_58;
  string shaderSource_59;
  string shaderSource_60;
  string shaderSource_61;
  string shaderSource_62;
  string shaderSource_63;
  string shaderSource_64;
  string shaderSource_65;
  string shaderSource_66;
  string shaderSource_67;
  string shaderSource_68;
  string shaderSource_69;
  string shaderSource_70;
  string shaderSource_71;
  string shaderSource_72;
  string shaderSource_73;
  string shaderSource_74;
  string shaderSource_75;
  string shaderSource_76;
  string shaderSource_77;
  string shaderSource_78;
  string shaderSource_79;
  string shaderSource_80;
  string shaderSource_81;
  string shaderSource_82;
  string shaderSource_83;
  string shaderSource_84;
  string shaderSource_85;
  string shaderSource_86;
  string shaderSource_87;
  string shaderSource_88;
  string shaderSource_89;
  string shaderSource_90;
  string shaderSource_91;
  string shaderSource_92;
  string shaderSource_93;
  string shaderSource_94;
  string shaderSource_95;
  string shaderSource_96;
  string shaderSource_97;
  string shaderSource_98;
  string shaderSource_99;
  string shaderSource_x00100;
  string shaderSource_x00101;
  string shaderSource_x00102;
  string shaderSource_x00103;
  string shaderSource_x00104;
  string shaderSource_x00105;
  string shaderSource_x00106;
  string shaderSource_x00107;
  string shaderSource_x00108;
  string shaderSource_x00109;
  string shaderSource_x00110;
  bool bVar3;
  ContextType CVar4;
  char *__s;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  DataType dataType;
  DataType dataType_00;
  long lVar7;
  string shaderSource;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff14c;
  DataType in_stack_fffffffffffff150;
  undefined4 in_stack_fffffffffffff154;
  _Alloc_hider _Var9;
  size_type sVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e98;
  long local_e88;
  allocator<char> local_e79;
  long *local_e78 [2];
  long local_e68 [2];
  long *local_e58 [2];
  long local_e48 [2];
  long *local_e38 [2];
  long local_e28 [2];
  long *local_e18 [2];
  long local_e08 [2];
  long *local_df8 [2];
  long local_de8 [2];
  long *local_dd8 [2];
  long local_dc8 [2];
  long *local_db8 [2];
  long local_da8 [2];
  long *local_d98 [2];
  long local_d88 [2];
  long *local_d78 [2];
  long local_d68 [2];
  long *local_d58 [2];
  long local_d48 [2];
  long *local_d38 [2];
  long local_d28 [2];
  long *local_d18 [2];
  long local_d08 [2];
  long *local_cf8 [2];
  long local_ce8 [2];
  long *local_cd8 [2];
  long local_cc8 [2];
  long *local_cb8 [2];
  long local_ca8 [2];
  long *local_c98 [2];
  long local_c88 [2];
  long *local_c78 [2];
  long local_c68 [2];
  long *local_c58 [2];
  long local_c48 [2];
  long *local_c38 [2];
  long local_c28 [2];
  long *local_c18 [2];
  long local_c08 [2];
  long *local_bf8 [2];
  long local_be8 [2];
  long *local_bd8 [2];
  long local_bc8 [2];
  long *local_bb8 [2];
  long local_ba8 [2];
  long *local_b98 [2];
  long local_b88 [2];
  long *local_b78 [2];
  long local_b68 [2];
  long *local_b58 [2];
  long local_b48 [2];
  long *local_b38 [2];
  long local_b28 [2];
  long *local_b18 [2];
  long local_b08 [2];
  long *local_af8 [2];
  long local_ae8 [2];
  long *local_ad8 [2];
  long local_ac8 [2];
  long *local_ab8 [2];
  long local_aa8 [2];
  long *local_a98 [2];
  long local_a88 [2];
  long *local_a78 [2];
  long local_a68 [2];
  long *local_a58 [2];
  long local_a48 [2];
  long *local_a38 [2];
  long local_a28 [2];
  long *local_a18 [2];
  long local_a08 [2];
  long *local_9f8 [2];
  long local_9e8 [2];
  long *local_9d8 [2];
  long local_9c8 [2];
  long *local_9b8 [2];
  long local_9a8 [2];
  long *local_998 [2];
  long local_988 [2];
  long *local_978 [2];
  long local_968 [2];
  long *local_958 [2];
  long local_948 [2];
  long *local_938 [2];
  long local_928 [2];
  long *local_918 [2];
  long local_908 [2];
  long *local_8f8 [2];
  long local_8e8 [2];
  long *local_8d8 [2];
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  long *local_898 [2];
  long local_888 [2];
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  long *local_838 [2];
  long local_828 [2];
  long *local_818 [2];
  long local_808 [2];
  long *local_7f8 [2];
  long local_7e8 [2];
  long *local_7d8 [2];
  long local_7c8 [2];
  long *local_7b8 [2];
  long local_7a8 [2];
  long *local_798 [2];
  long local_788 [2];
  long *local_778 [2];
  long local_768 [2];
  long *local_758 [2];
  long local_748 [2];
  long *local_738 [2];
  long local_728 [2];
  long *local_718 [2];
  long local_708 [2];
  long *local_6f8 [2];
  long local_6e8 [2];
  long *local_6d8 [2];
  long local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long local_98;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  _Var9._M_p = (pointer)&local_e98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff158,"texture: Invalid P type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p != &local_e98) {
    operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
  }
  lVar7 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar7];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_98 = lVar7;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_e79);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c82f43);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar6) {
        local_e98._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_e98._8_8_ = plVar5[3];
        _Var9._M_p = (pointer)&local_e98;
      }
      else {
        local_e98._M_allocated_capacity = paVar6->_M_allocated_capacity;
        _Var9._M_p = (pointer)*plVar5;
      }
      sVar10 = plVar5[1];
      *plVar5 = (long)paVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &local_e98) {
        operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar7 = 0;
      do {
        if (lVar7 != 4) {
          DVar1 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar7)
          ;
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x28,DVar1,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_00._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_00._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_00._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_00.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_b8[0],shaderSource_00);
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0],local_a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_01._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_01._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_01._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_01.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d8[0],shaderSource_01);
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x35,DVar1,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_02._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_02._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_02._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_02.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_02.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_f8[0],shaderSource_02);
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0],local_e8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_118[0] = local_108;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_118,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_03._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_03._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_03._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_03.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_03.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_118[0],shaderSource_03);
          if (local_118[0] != local_108) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3c,DVar1,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_138[0] = local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_138,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_04._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_04._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_04._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_04.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_04.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_138[0],shaderSource_04);
          if (local_138[0] != local_128) {
            operator_delete(local_138[0],local_128[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_158[0] = local_148;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_158,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_05._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_05._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_05._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_05.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_05.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_158[0],shaderSource_05);
          if (local_158[0] != local_148) {
            operator_delete(local_158[0],local_148[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        DVar1 = *(DataType *)
                 ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar7);
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x28,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_178,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_06._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_06._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_06._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_06.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_06.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_178[0],shaderSource_06);
        if (local_178[0] != local_168) {
          operator_delete(local_178[0],local_168[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_198[0] = local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_07._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_07._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_07._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_07.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_07.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_198[0],shaderSource_07);
        if (local_198[0] != local_188) {
          operator_delete(local_198[0],local_188[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x35,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_1b8[0] = local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_08._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_08._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_08._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_08.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_08.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_1b8[0],shaderSource_08);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_09._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_09._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_09._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_09._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_09.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_09.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_1d8[0],shaderSource_09);
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3c,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_1f8[0] = local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_10._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_10._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_10._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_10._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_10.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_10.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_1f8[0],shaderSource_10);
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_11._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_11._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_11._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_11._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_11.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_11.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_218[0],shaderSource_11);
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        samplerDataType =
             *(DataType *)
              ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar7);
        uVar8 = 0x5e;
        local_e88 = lVar7;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x28,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_238[0] = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_12._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_12._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_12._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_12._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_12.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_12.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_238[0],shaderSource_12);
        if (local_238[0] != local_228) {
          operator_delete(local_238[0],local_228[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_13._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_13._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_13._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_13._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_13.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_13.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_258[0],shaderSource_13);
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x35,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_278[0] = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_14._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_14._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_14._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_14._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_14.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_14.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_278[0],shaderSource_14);
        if (local_278[0] != local_268) {
          operator_delete(local_278[0],local_268[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_15._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_15._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_15._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_15._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_15.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_15.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_298[0],shaderSource_15);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0],local_288[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3c,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_16._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_16._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_16._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_16._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_16.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_16.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_2b8[0],shaderSource_16);
        if (local_2b8[0] != local_2a8) {
          operator_delete(local_2b8[0],local_2a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_2d8[0] = local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_17._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_17._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_17._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_17._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_17.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_17.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_2d8[0],shaderSource_17);
        if (local_2d8[0] != local_2c8) {
          operator_delete(local_2d8[0],local_2c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_e88);
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2c,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_2f8[0] = local_2e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_18._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_18._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_18._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_18._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_18.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_18.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_2f8[0],shaderSource_18);
          if (local_2f8[0] != local_2e8) {
            operator_delete(local_2f8[0],local_2e8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_318[0] = local_308;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_318,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_19._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_19._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_19._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_19._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_19.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_19.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_318[0],shaderSource_19);
          if (local_318[0] != local_308) {
            operator_delete(local_318[0],local_308[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x39,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_338[0] = local_328;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_20._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_20._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_20._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_20._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_20.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_20.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_338[0],shaderSource_20);
          if (local_338[0] != local_328) {
            operator_delete(local_338[0],local_328[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_358[0] = local_348;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_358,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_21._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_21._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_21._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_21._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_21.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_21.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_358[0],shaderSource_21);
          if (local_358[0] != local_348) {
            operator_delete(local_358[0],local_348[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x40,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_378[0] = local_368;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_378,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_22._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_22._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_22._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_22._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_22.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_22.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_378[0],shaderSource_22);
          if (local_378[0] != local_368) {
            operator_delete(local_378[0],local_368[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_398[0] = local_388;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_398,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_23._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_23._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_23._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_23._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_23.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_23.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_398[0],shaderSource_23);
          if (local_398[0] != local_388) {
            operator_delete(local_398[0],local_388[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2c,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_24._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_24._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_24._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_24._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_24.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_24.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3b8[0],shaderSource_24);
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_3d8[0] = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_25._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_25._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_25._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_25._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_25.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_25.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3d8[0],shaderSource_25);
        if (local_3d8[0] != local_3c8) {
          operator_delete(local_3d8[0],local_3c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x39,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_3f8[0] = local_3e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_26._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_26._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_26._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_26._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_26.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_26.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_3f8[0],shaderSource_26);
        if (local_3f8[0] != local_3e8) {
          operator_delete(local_3f8[0],local_3e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_418[0] = local_408;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_418,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_27._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_27._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_27._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_27._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_27.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_27.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_418[0],shaderSource_27);
        if (local_418[0] != local_408) {
          operator_delete(local_418[0],local_408[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x40,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_438[0] = local_428;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_28._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_28._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_28._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_28._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_28.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_28.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_438[0],shaderSource_28);
        if (local_438[0] != local_428) {
          operator_delete(local_438[0],local_428[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_458[0] = local_448;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_458,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_29._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_29._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_29._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_29._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_29.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_29.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_458[0],shaderSource_29);
        if (local_458[0] != local_448) {
          operator_delete(local_458[0],local_448[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2c,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_478[0] = local_468;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_478,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_30._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_30._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_30._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_30._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_30.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_30.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_478[0],shaderSource_30);
        if (local_478[0] != local_468) {
          operator_delete(local_478[0],local_468[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_498[0] = local_488;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_498,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_31._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_31._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_31._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_31._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_31.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_31.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_498[0],shaderSource_31);
        if (local_498[0] != local_488) {
          operator_delete(local_498[0],local_488[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x39,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_4b8[0] = local_4a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4b8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_32._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_32._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_32._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_32._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_32.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_32.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_4b8[0],shaderSource_32);
        if (local_4b8[0] != local_4a8) {
          operator_delete(local_4b8[0],local_4a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_4d8[0] = local_4c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4d8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_33._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_33._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_33._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_33._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_33.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_33.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_4d8[0],shaderSource_33);
        if (local_4d8[0] != local_4c8) {
          operator_delete(local_4d8[0],local_4c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x40,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_4f8[0] = local_4e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_34._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_34._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_34._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_34._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_34.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_34.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_4f8[0],shaderSource_34);
        if (local_4f8[0] != local_4e8) {
          operator_delete(local_4f8[0],local_4e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_518[0] = local_508;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_35._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_35._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_35._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_35._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_35.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_35.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_518[0],shaderSource_35);
        if (local_518[0] != local_508) {
          operator_delete(local_518[0],local_508[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_e88);
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x29,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_538[0] = local_528;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_538,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_36._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_36._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_36._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_36._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_36.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_36.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_538[0],shaderSource_36);
          if (local_538[0] != local_528) {
            operator_delete(local_538[0],local_528[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_558[0] = local_548;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_558,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_37._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_37._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_37._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_37._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_37.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_37.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_558[0],shaderSource_37);
          if (local_558[0] != local_548) {
            operator_delete(local_558[0],local_548[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x36,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_578[0] = local_568;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_578,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_38._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_38._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_38._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_38._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_38.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_38.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_578[0],shaderSource_38);
          if (local_578[0] != local_568) {
            operator_delete(local_578[0],local_568[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_598[0] = local_588;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_598,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_39._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_39._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_39._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_39._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_39.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_39.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_598[0],shaderSource_39);
          if (local_598[0] != local_588) {
            operator_delete(local_598[0],local_588[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3d,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_5b8[0] = local_5a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_40._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_40._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_40._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_40._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_40.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_40.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_5b8[0],shaderSource_40);
          if (local_5b8[0] != local_5a8) {
            operator_delete(local_5b8[0],local_5a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_5d8[0] = local_5c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5d8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_41._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_41._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_41._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_41._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_41.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_41.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_5d8[0],shaderSource_41);
          if (local_5d8[0] != local_5c8) {
            operator_delete(local_5d8[0],local_5c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x29,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_5f8[0] = local_5e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_42._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_42._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_42._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_42._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_42.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_42.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_5f8[0],shaderSource_42);
        if (local_5f8[0] != local_5e8) {
          operator_delete(local_5f8[0],local_5e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_618[0] = local_608;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_618,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_43._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_43._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_43._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_43._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_43.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_43.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_618[0],shaderSource_43);
        if (local_618[0] != local_608) {
          operator_delete(local_618[0],local_608[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x36,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_638[0] = local_628;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_638,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_44._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_44._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_44._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_44._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_44.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_44.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_638[0],shaderSource_44);
        if (local_638[0] != local_628) {
          operator_delete(local_638[0],local_628[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_658[0] = local_648;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_658,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_45._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_45._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_45._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_45._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_45.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_45.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_658[0],shaderSource_45);
        if (local_658[0] != local_648) {
          operator_delete(local_658[0],local_648[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3d,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_678[0] = local_668;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_678,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_46._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_46._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_46._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_46._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_46.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_46.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_678[0],shaderSource_46);
        if (local_678[0] != local_668) {
          operator_delete(local_678[0],local_668[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_698[0] = local_688;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_698,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_47._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_47._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_47._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_47._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_47.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_47.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_698[0],shaderSource_47);
        if (local_698[0] != local_688) {
          operator_delete(local_698[0],local_688[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x29,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_6b8[0] = local_6a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6b8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_48._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_48._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_48._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_48._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_48.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_48.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_6b8[0],shaderSource_48);
        if (local_6b8[0] != local_6a8) {
          operator_delete(local_6b8[0],local_6a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_6d8[0] = local_6c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6d8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_49._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_49._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_49._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_49._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_49.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_49.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_6d8[0],shaderSource_49);
        if (local_6d8[0] != local_6c8) {
          operator_delete(local_6d8[0],local_6c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x36,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_6f8[0] = local_6e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_50._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_50._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_50._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_50._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_50.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_50.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_6f8[0],shaderSource_50);
        if (local_6f8[0] != local_6e8) {
          operator_delete(local_6f8[0],local_6e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_718[0] = local_708;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_718,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_51._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_51._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_51._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_51._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_51.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_51.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_718[0],shaderSource_51);
        if (local_718[0] != local_708) {
          operator_delete(local_718[0],local_708[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3d,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_738[0] = local_728;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_738,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_52._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_52._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_52._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_52._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_52.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_52.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_738[0],shaderSource_52);
        if (local_738[0] != local_728) {
          operator_delete(local_738[0],local_728[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_758[0] = local_748;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_758,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_53._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_53._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_53._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_53._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_53.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_53.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_758[0],shaderSource_53);
        if (local_758[0] != local_748) {
          operator_delete(local_758[0],local_748[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_e88);
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2b,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_778[0] = local_768;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_778,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_54._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_54._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_54._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_54._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_54.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_54.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_778[0],shaderSource_54);
          if (local_778[0] != local_768) {
            operator_delete(local_778[0],local_768[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_798[0] = local_788;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_798,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_55._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_55._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_55._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_55._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_55.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_55.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_798[0],shaderSource_55);
          if (local_798[0] != local_788) {
            operator_delete(local_798[0],local_788[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x38,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_7b8[0] = local_7a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7b8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_56._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_56._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_56._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_56._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_56.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_56.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_7b8[0],shaderSource_56);
          if (local_7b8[0] != local_7a8) {
            operator_delete(local_7b8[0],local_7a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_7d8[0] = local_7c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7d8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_57._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_57._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_57._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_57._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_57.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_57.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_7d8[0],shaderSource_57);
          if (local_7d8[0] != local_7c8) {
            operator_delete(local_7d8[0],local_7c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3f,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_7f8[0] = local_7e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7f8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_58._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_58._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_58._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_58._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_58.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_58.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_7f8[0],shaderSource_58);
          if (local_7f8[0] != local_7e8) {
            operator_delete(local_7f8[0],local_7e8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_818[0] = local_808;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_818,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_59._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_59._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_59._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_59._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_59.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_59.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_818[0],shaderSource_59);
          if (local_818[0] != local_808) {
            operator_delete(local_818[0],local_808[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2b,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_838[0] = local_828;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_838,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_60._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_60._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_60._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_60._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_60.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_60.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_838[0],shaderSource_60);
        if (local_838[0] != local_828) {
          operator_delete(local_838[0],local_828[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_858[0] = local_848;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_858,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_61._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_61._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_61._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_61._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_61.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_61.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_858[0],shaderSource_61);
        if (local_858[0] != local_848) {
          operator_delete(local_858[0],local_848[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x38,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_878[0] = local_868;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_878,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_62._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_62._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_62._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_62._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_62.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_62.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_878[0],shaderSource_62);
        if (local_878[0] != local_868) {
          operator_delete(local_878[0],local_868[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_898[0] = local_888;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_898,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_63._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_63._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_63._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_63._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_63.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_63.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_898[0],shaderSource_63);
        if (local_898[0] != local_888) {
          operator_delete(local_898[0],local_888[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3f,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_8b8[0] = local_8a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8b8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_64._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_64._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_64._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_64._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_64.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_64.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_8b8[0],shaderSource_64);
        if (local_8b8[0] != local_8a8) {
          operator_delete(local_8b8[0],local_8a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_8d8[0] = local_8c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8d8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_65._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_65._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_65._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_65._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_65.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_65.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_8d8[0],shaderSource_65);
        if (local_8d8[0] != local_8c8) {
          operator_delete(local_8d8[0],local_8c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2b,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_8f8[0] = local_8e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_66._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_66._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_66._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_66._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_66.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_66.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_8f8[0],shaderSource_66);
        if (local_8f8[0] != local_8e8) {
          operator_delete(local_8f8[0],local_8e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_918[0] = local_908;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_918,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_67._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_67._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_67._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_67._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_67.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_67.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_918[0],shaderSource_67);
        if (local_918[0] != local_908) {
          operator_delete(local_918[0],local_908[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x38,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_938[0] = local_928;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_938,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_68._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_68._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_68._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_68._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_68.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_68.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_938[0],shaderSource_68);
        if (local_938[0] != local_928) {
          operator_delete(local_938[0],local_928[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_958[0] = local_948;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_958,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_69._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_69._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_69._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_69._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_69.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_69.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_958[0],shaderSource_69);
        if (local_958[0] != local_948) {
          operator_delete(local_958[0],local_948[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3f,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_978[0] = local_968;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_978,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_70._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_70._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_70._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_70._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_70.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_70.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_978[0],shaderSource_70);
        if (local_978[0] != local_968) {
          operator_delete(local_978[0],local_968[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_998[0] = local_988;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_998,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_71._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_71._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_71._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_71._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_71.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_71.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_998[0],shaderSource_71);
        if (local_998[0] != local_988) {
          operator_delete(local_998[0],local_988[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_e88);
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2f,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_9b8[0] = local_9a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_9b8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_72._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_72._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_72._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_72._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_72.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_72.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_9b8[0],shaderSource_72);
          if (local_9b8[0] != local_9a8) {
            operator_delete(local_9b8[0],local_9a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_9d8[0] = local_9c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_9d8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_73._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_73._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_73._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_73._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_73.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_73.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_9d8[0],shaderSource_73);
          if (local_9d8[0] != local_9c8) {
            operator_delete(local_9d8[0],local_9c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2f,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_9f8[0] = local_9e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_9f8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_74._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_74._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_74._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_74._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_74.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_74.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_9f8[0],shaderSource_74);
        if (local_9f8[0] != local_9e8) {
          operator_delete(local_9f8[0],local_9e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_a18[0] = local_a08;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a18,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_75._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_75._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_75._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_75._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_75.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_75.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_a18[0],shaderSource_75);
        if (local_a18[0] != local_a08) {
          operator_delete(local_a18[0],local_a08[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2f,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_a38[0] = local_a28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a38,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_76._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_76._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_76._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_76._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_76.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_76.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_a38[0],shaderSource_76);
        if (local_a38[0] != local_a28) {
          operator_delete(local_a38[0],local_a28[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_a58[0] = local_a48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a58,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_77._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_77._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_77._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_77._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_77.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_77.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_a58[0],shaderSource_77);
        if (local_a58[0] != local_a48) {
          operator_delete(local_a58[0],local_a48[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        if (local_e88 != 0xc) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_e88);
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x30,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_a78[0] = local_a68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a78,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_78._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_78._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_78._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_78._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_78.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_78.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_a78[0],shaderSource_78);
          if (local_a78[0] != local_a68) {
            operator_delete(local_a78[0],local_a68[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_a98[0] = local_a88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a98,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_79._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_79._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_79._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_79._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_79.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_79.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_a98[0],shaderSource_79);
          if (local_a98[0] != local_a88) {
            operator_delete(local_a98[0],local_a88[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x30,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_ab8[0] = local_aa8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_ab8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_80._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_80._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_80._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_80._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_80.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_80.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_ab8[0],shaderSource_80);
        if (local_ab8[0] != local_aa8) {
          operator_delete(local_ab8[0],local_aa8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_ad8[0] = local_ac8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_ad8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_81._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_81._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_81._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_81._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_81.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_81.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_ad8[0],shaderSource_81);
        if (local_ad8[0] != local_ac8) {
          operator_delete(local_ad8[0],local_ac8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x30,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_af8[0] = local_ae8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_af8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_82._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_82._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_82._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_82._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_82.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_82.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_af8[0],shaderSource_82);
        if (local_af8[0] != local_ae8) {
          operator_delete(local_af8[0],local_ae8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_b18[0] = local_b08;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b18,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_83._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_83._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_83._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_83._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_83.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_83.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_b18[0],shaderSource_83);
        if (local_b18[0] != local_b08) {
          operator_delete(local_b18[0],local_b08[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        if (local_e88 != 0xc) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                   local_e88);
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x32,DVar2,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_b38[0] = local_b28;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b38,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_84._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_84._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_84._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_84._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_84.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_84.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_b38[0],shaderSource_84);
          if (local_b38[0] != local_b28) {
            operator_delete(local_b38[0],local_b28[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x32,DVar2,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_b58[0] = local_b48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b58,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_85._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_85._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_85._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_85._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_85.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_85.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_b58[0],shaderSource_85);
          if (local_b58[0] != local_b48) {
            operator_delete(local_b58[0],local_b48[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x32,DVar1,TYPE_LAST,
                   in_stack_fffffffffffff150);
        local_b78[0] = local_b68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b78,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_86._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_86._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_86._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_86._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_86.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_86.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_b78[0],shaderSource_86);
        if (local_b78[0] != local_b68) {
          operator_delete(local_b78[0],local_b68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x32,DVar1,
                   TYPE_FLOAT,in_stack_fffffffffffff150);
        local_b98[0] = local_b88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b98,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_87._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_87._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_87._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_87._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_87.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_87.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_b98[0],shaderSource_87);
        if (local_b98[0] != local_b88) {
          operator_delete(local_b98[0],local_b88[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 0x5e;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x32,samplerDataType,
                   TYPE_LAST,in_stack_fffffffffffff150);
        local_bb8[0] = local_ba8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_bb8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_88._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_88._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_88._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_88._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_88.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_88.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_bb8[0],shaderSource_88);
        if (local_bb8[0] != local_ba8) {
          operator_delete(local_bb8[0],local_ba8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        uVar8 = 1;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x32,samplerDataType
                   ,TYPE_FLOAT,in_stack_fffffffffffff150);
        local_bd8[0] = local_bc8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_bd8,_Var9._M_p,_Var9._M_p + sVar10);
        shaderSource_89._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
        shaderSource_89._M_dataplus._M_p._0_4_ = uVar8;
        shaderSource_89._M_string_length._0_4_ = in_stack_fffffffffffff150;
        shaderSource_89._M_string_length._4_4_ = in_stack_fffffffffffff154;
        shaderSource_89.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
        shaderSource_89.field_2._8_8_ = sVar10;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_bd8[0],shaderSource_89);
        if (local_bd8[0] != local_bc8) {
          operator_delete(local_bd8[0],local_bc8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_e98) {
          operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
        }
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        if (bVar3) {
LAB_015ff159:
          if (local_e88 != 0xc) {
            DVar2 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                     local_e88);
            uVar8 = 0x5e;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2d,DVar2,
                       TYPE_LAST,in_stack_fffffffffffff150);
            local_bf8[0] = local_be8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_bf8,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_90._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_90._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_90._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_90._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_90.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_90.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_bf8[0],shaderSource_90);
            if (local_bf8[0] != local_be8) {
              operator_delete(local_bf8[0],local_be8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
            uVar8 = 1;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,DVar2,
                       TYPE_FLOAT,in_stack_fffffffffffff150);
            local_c18[0] = local_c08;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c18,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_91._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_91._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_91._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_91._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_91.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_91.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_c18[0],shaderSource_91);
            if (local_c18[0] != local_c08) {
              operator_delete(local_c18[0],local_c08[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
            uVar8 = 0x5e;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3a,DVar2,
                       TYPE_LAST,in_stack_fffffffffffff150);
            local_c38[0] = local_c28;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c38,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_92._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_92._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_92._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_92._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_92.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_92.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_c38[0],shaderSource_92);
            if (local_c38[0] != local_c28) {
              operator_delete(local_c38[0],local_c28[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
            uVar8 = 1;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,DVar2,
                       TYPE_FLOAT,in_stack_fffffffffffff150);
            local_c58[0] = local_c48;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c58,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_93._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_93._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_93._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_93._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_93.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_93.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_c58[0],shaderSource_93);
            if (local_c58[0] != local_c48) {
              operator_delete(local_c58[0],local_c48[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
            uVar8 = 0x5e;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x41,DVar2,
                       TYPE_LAST,in_stack_fffffffffffff150);
            local_c78[0] = local_c68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c78,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_94._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_94._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_94._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_94._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_94.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_94.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_c78[0],shaderSource_94);
            if (local_c78[0] != local_c68) {
              operator_delete(local_c78[0],local_c68[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
            uVar8 = 1;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,DVar2,
                       TYPE_FLOAT,in_stack_fffffffffffff150);
            local_c98[0] = local_c88;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c98,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_95._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_95._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_95._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_95._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_95.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_95.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_c98[0],shaderSource_95);
            if (local_c98[0] != local_c88) {
              operator_delete(local_c98[0],local_c88[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2d,DVar1,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_cb8[0] = local_ca8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_cb8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_96._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_96._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_96._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_96._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_96.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_96.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_cb8[0],shaderSource_96);
          if (local_cb8[0] != local_ca8) {
            operator_delete(local_cb8[0],local_ca8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_cd8[0] = local_cc8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_cd8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_97._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_97._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_97._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_97._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_97.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_97.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_cd8[0],shaderSource_97);
          if (local_cd8[0] != local_cc8) {
            operator_delete(local_cd8[0],local_cc8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3a,DVar1,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_cf8[0] = local_ce8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_cf8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_98._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_98._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_98._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_98._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_98.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_98.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_cf8[0],shaderSource_98);
          if (local_cf8[0] != local_ce8) {
            operator_delete(local_cf8[0],local_ce8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_d18[0] = local_d08;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d18,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_99._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_99._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_99._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_99._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_99.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_99.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d18[0],shaderSource_99);
          if (local_d18[0] != local_d08) {
            operator_delete(local_d18[0],local_d08[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x41,DVar1,TYPE_LAST
                     ,in_stack_fffffffffffff150);
          local_d38[0] = local_d28;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d38,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00100._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00100._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00100._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00100._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00100.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00100.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d38[0],shaderSource_x00100);
          if (local_d38[0] != local_d28) {
            operator_delete(local_d38[0],local_d28[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_d58[0] = local_d48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d58,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00101._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00101._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00101._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00101._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00101.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00101.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d58[0],shaderSource_x00101);
          if (local_d58[0] != local_d48) {
            operator_delete(local_d58[0],local_d48[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2d,samplerDataType
                     ,TYPE_LAST,in_stack_fffffffffffff150);
          local_d78[0] = local_d68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d78,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00102._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00102._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00102._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00102._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00102.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00102.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d78[0],shaderSource_x00102);
          if (local_d78[0] != local_d68) {
            operator_delete(local_d78[0],local_d68[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,
                     samplerDataType,TYPE_FLOAT,in_stack_fffffffffffff150);
          local_d98[0] = local_d88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d98,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00103._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00103._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00103._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00103._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00103.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00103.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d98[0],shaderSource_x00103);
          if (local_d98[0] != local_d88) {
            operator_delete(local_d98[0],local_d88[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3a,samplerDataType
                     ,TYPE_LAST,in_stack_fffffffffffff150);
          local_db8[0] = local_da8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_db8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00104._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00104._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00104._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00104._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00104.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00104.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_db8[0],shaderSource_x00104);
          if (local_db8[0] != local_da8) {
            operator_delete(local_db8[0],local_da8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,
                     samplerDataType,TYPE_FLOAT,in_stack_fffffffffffff150);
          local_dd8[0] = local_dc8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_dd8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00105._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00105._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00105._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00105._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00105.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00105.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_dd8[0],shaderSource_x00105);
          if (local_dd8[0] != local_dc8) {
            operator_delete(local_dd8[0],local_dc8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 0x5e;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x41,samplerDataType
                     ,TYPE_LAST,in_stack_fffffffffffff150);
          local_df8[0] = local_de8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_df8,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00106._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00106._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00106._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00106._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00106.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00106.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_df8[0],shaderSource_x00106);
          if (local_df8[0] != local_de8) {
            operator_delete(local_df8[0],local_de8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,
                     samplerDataType,TYPE_FLOAT,in_stack_fffffffffffff150);
          local_e18[0] = local_e08;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e18,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00107._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00107._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00107._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00107._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00107.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00107.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_e18[0],shaderSource_x00107);
          if (local_e18[0] != local_e08) {
            operator_delete(local_e18[0],local_e08[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_70,(_anonymous_namespace_ *)0x2d,dataType);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) goto LAB_015ff159;
        }
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        if (bVar3) {
LAB_015ffd70:
          if (local_e88 != 0xc) {
            uVar8 = 1;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                       *(DataType *)
                        ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                        local_e88),TYPE_FLOAT,in_stack_fffffffffffff150);
            local_e38[0] = local_e28;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_e38,_Var9._M_p,_Var9._M_p + sVar10);
            shaderSource_x00108._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
            shaderSource_x00108._M_dataplus._M_p._0_4_ = uVar8;
            shaderSource_x00108._M_string_length._0_4_ = in_stack_fffffffffffff150;
            shaderSource_x00108._M_string_length._4_4_ = in_stack_fffffffffffff154;
            shaderSource_x00108.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
            shaderSource_x00108.field_2._8_8_ = sVar10;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_e38[0],shaderSource_x00108);
            if (local_e38[0] != local_e28) {
              operator_delete(local_e38[0],local_e28[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &local_e98) {
              operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
            }
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,DVar1,
                     TYPE_FLOAT,in_stack_fffffffffffff150);
          local_e58[0] = local_e48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e58,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00109._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00109._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00109._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00109._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00109.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00109.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_e58[0],shaderSource_x00109);
          if (local_e58[0] != local_e48) {
            operator_delete(local_e58[0],local_e48[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
          uVar8 = 1;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff158,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                     samplerDataType,TYPE_FLOAT,in_stack_fffffffffffff150);
          local_e78[0] = local_e68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e78,_Var9._M_p,_Var9._M_p + sVar10);
          shaderSource_x00110._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff14c;
          shaderSource_x00110._M_dataplus._M_p._0_4_ = uVar8;
          shaderSource_x00110._M_string_length._0_4_ = in_stack_fffffffffffff150;
          shaderSource_x00110._M_string_length._4_4_ = in_stack_fffffffffffff154;
          shaderSource_x00110.field_2._M_allocated_capacity = (size_type)_Var9._M_p;
          shaderSource_x00110.field_2._8_8_ = sVar10;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_e78[0],shaderSource_x00110);
          if (local_e78[0] != local_e68) {
            operator_delete(local_e78[0],local_e68[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != &local_e98) {
            operator_delete(_Var9._M_p,local_e98._M_allocated_capacity + 1);
          }
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_90,(_anonymous_namespace_ *)0x33,dataType_00);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) goto LAB_015ffd70;
        }
        lVar7 = local_e88 + 4;
      } while (lVar7 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar7 = local_98;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
  } while( true );
}

Assistant:

void texture_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid P type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC2)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}